

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O1

void __thiscall
UnscentedKalmanFilter::PredictMeanAndCovariance
          (UnscentedKalmanFilter *this,MatrixXd *Xsig_pred,VectorXd *x,MatrixXd *P)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  ulong uVar4;
  double dVar5;
  uint uVar6;
  Index index;
  double *pdVar7;
  ulong uVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  ulong uVar11;
  double *pdVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  Index size;
  Index othersize;
  Index size_1;
  VectorXd x_diff;
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  tmp;
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> es;
  VectorXd local_158;
  MatrixXd *local_148;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_140;
  UnscentedKalmanFilter *local_138;
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_130;
  undefined1 local_118 [24];
  MatrixXd *local_100;
  double dStack_f8;
  scalar_multiple_op<double> local_f0;
  double *local_e8;
  double *local_d0;
  double *local_b8;
  double *local_a8;
  double *local_90;
  double *local_80;
  double *local_58;
  double *local_40;
  
  lVar16 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_148 = Xsig_pred;
  if (lVar16 < 0) {
    pcVar13 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar16,1);
    lVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (lVar2 != lVar16) {
      pcVar13 = 
      "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
      ;
LAB_0011d095:
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                    ,0x1f9,pcVar13);
    }
    uVar11 = lVar2 - (lVar2 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar2) {
      lVar16 = 0;
      do {
        pdVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data + lVar16;
        *pdVar12 = 0.0;
        pdVar12[1] = 0.0;
        lVar16 = lVar16 + 2;
      } while (lVar16 < (long)uVar11);
    }
    if ((long)uVar11 < lVar2) {
      memset((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             (lVar2 / 2) * 2,0,lVar2 * 8 + (lVar2 / 2) * -0x10);
    }
    local_118._0_8_ =
         (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    local_118._8_8_ =
         (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
    local_118._16_8_ = (undefined1 *)0x0;
    if (-1 < (long)(local_118._8_8_ | local_118._0_8_)) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)P,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)local_118);
      if (0 < this->n_sigma_) {
        lVar16 = 0;
        do {
          if ((this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows <= lVar16) goto LAB_0011d02b;
          dVar3 = (double)(local_148->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                          m_storage.m_rows;
          pdVar12 = (local_148->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_data + (long)dVar3 * lVar16;
          if ((long)dVar3 < 0 && pdVar12 != (double *)0x0) goto LAB_0011d00c;
          if ((local_148->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_cols <= lVar16) goto LAB_0011cfed;
          local_f0.m_other =
               (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[lVar16];
          local_100 = local_148;
          local_130.m_matrix = x;
          local_130.m_functor = (scalar_sum_op<double> *)&local_158;
          local_118._0_8_ = pdVar12;
          local_118._8_8_ = dVar3;
          dStack_f8 = dVar3;
          Eigen::
          SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>
          ::operator=(&local_130,
                      (CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                       *)local_118);
          lVar16 = lVar16 + 1;
        } while (lVar16 < this->n_sigma_);
      }
      NormalizeState(this,x);
      uVar6 = this->type_ - UKFModified;
      if ((int)(uint)(uVar6 < 2) < this->n_sigma_) {
        uVar11 = (ulong)(uVar6 < 2);
        lVar16 = (ulong)(uVar6 < 2) << 3;
        local_140 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)P;
        local_138 = this;
        do {
          local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               = (double *)0x0;
          local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               = 0;
          pdVar12 = (local_148->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_data;
          if (this->type_ - UKFModified < 2) {
            uVar4 = (local_148->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_rows;
            if (((long)uVar4 < 0) && (pdVar12 + uVar4 * uVar11 != (double *)0x0)) goto LAB_0011d00c;
            lVar2 = (local_148->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_cols;
            if (lVar2 <= (long)uVar11) goto LAB_0011cfed;
            if (pdVar12 != (double *)0x0 && (long)uVar4 < 0) goto LAB_0011d00c;
            if (lVar2 < 1) goto LAB_0011cfed;
            if ((long)uVar4 < 0) {
LAB_0011d061:
              __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                            ,0xf1,
                            "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                           );
            }
            pdVar7 = local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            if (uVar4 != 0) {
              free((void *)0x0);
              if (uVar4 == 0) {
                local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = (double *)0x0;
                pdVar7 = local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data;
              }
              else if ((0x1fffffffffffffff < uVar4) ||
                      (pdVar7 = (double *)malloc(uVar4 * 8), pdVar7 == (double *)0x0)) {
                puVar10 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar10 = operator_delete;
                __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
            }
            local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data = pdVar7;
            uVar8 = uVar4 & 0x7ffffffffffffffe;
            if (1 < (long)uVar4) {
              uVar15 = 0;
              do {
                pdVar7 = (double *)((long)pdVar12 + uVar15 * 8 + uVar4 * lVar16);
                dVar3 = pdVar7[1];
                dVar5 = (pdVar12 + uVar15)[1];
                local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data[uVar15] = *pdVar7 - pdVar12[uVar15];
                (local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data + uVar15)[1] = dVar3 - dVar5;
                uVar15 = uVar15 + 2;
              } while (uVar15 < uVar8);
            }
            local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows = uVar4;
            if ((long)uVar8 < (long)uVar4) {
              do {
                local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data[uVar8] =
                     *(double *)((long)pdVar12 + uVar8 * 8 + uVar4 * lVar16) - pdVar12[uVar8];
                uVar8 = uVar8 + 1;
              } while (uVar4 != uVar8);
            }
          }
          else {
            uVar4 = (local_148->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_rows;
            if (((long)uVar4 < 0) && (pdVar12 + uVar4 * uVar11 != (double *)0x0)) {
LAB_0011d00c:
              __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/MapBase.h"
                            ,0x94,
                            "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                           );
            }
            if ((local_148->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_cols <= (long)uVar11) {
LAB_0011cfed:
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                            ,0x76,
                            "Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                           );
            }
            uVar8 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_rows;
            if (uVar4 != uVar8) {
              pcVar13 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
              ;
              goto LAB_0011d0b4;
            }
            if ((long)uVar8 < 0) goto LAB_0011d061;
            pdVar7 = local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            if (uVar8 != 0) {
              free((void *)0x0);
              if (uVar8 == 0) {
                local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = (double *)0x0;
                pdVar7 = local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data;
              }
              else if ((0x1fffffffffffffff < uVar8) ||
                      (pdVar7 = (double *)malloc(uVar8 * 8), pdVar7 == (double *)0x0)) {
                puVar10 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar10 = operator_delete;
                __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
            }
            local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data = pdVar7;
            local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows = uVar8;
            if (uVar8 != (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows) {
              pcVar13 = 
              "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>]"
              ;
              goto LAB_0011d095;
            }
            uVar15 = uVar8 & 0x7ffffffffffffffe;
            if (1 < (long)uVar8) {
              uVar14 = 0;
              do {
                pdVar7 = (double *)((long)pdVar12 + uVar14 * 8 + uVar4 * lVar16);
                dVar3 = pdVar7[1];
                pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + uVar14;
                dVar5 = pdVar1[1];
                local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data[uVar14] = *pdVar7 - *pdVar1;
                (local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data + uVar14)[1] = dVar3 - dVar5;
                uVar14 = uVar14 + 2;
              } while (uVar14 < uVar15);
            }
            if ((long)uVar15 < (long)uVar8) {
              pdVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                       .m_data;
              do {
                local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data[uVar15] =
                     *(double *)((long)pdVar12 + uVar15 * 8 + uVar4 * lVar16) - pdVar7[uVar15];
                uVar15 = uVar15 + 1;
              } while (uVar8 != uVar15);
            }
          }
          this = local_138;
          NormalizeState(local_138,&local_158);
          P = (MatrixXd *)local_140;
          if ((this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows <= (long)uVar11) {
LAB_0011d02b:
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0xad,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                         );
          }
          local_118._8_8_ =
               (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[uVar11];
          local_100 = (MatrixXd *)0x0;
          dStack_f8 = 0.0;
          local_f0.m_other = 0.0;
          local_130.m_matrix = (Matrix<double,__1,_1,_0,__1,_1> *)local_140;
          local_118._0_8_ = &local_158;
          local_118._16_8_ = &local_158;
          local_130.m_functor =
               (scalar_sum_op<double> *)
               Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_118);
          if ((*(double *)((long)P + 8) != *(double *)(local_118._0_8_ + 8)) ||
             (*(long *)((long)P + 0x10) != *(long *)(local_118._16_8_ + 8))) {
            pcVar13 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>]"
            ;
LAB_0011d0b4:
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseBinaryOp.h"
                          ,0x84,pcVar13);
          }
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)P,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                      *)&local_130);
          free(local_100);
          free(local_158.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
          uVar11 = uVar11 + 1;
          lVar16 = lVar16 + 8;
        } while ((long)uVar11 < (long)this->n_sigma_);
      }
      if (2 < this->debug_) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x pred:\n",8);
        poVar9 = Eigen::operator<<((ostream *)&std::cout,
                                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P pred:\n",8);
        poVar9 = Eigen::operator<<((ostream *)&std::cout,
                                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)P);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::EigenSolver
                  ((EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_118,P,true);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Eigenvalues of P pred:\n",0x17);
        if (local_f0.m_other._0_1_ == false) {
          __assert_fail("m_isInitialized && \"EigenSolver is not initialized.\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Eigenvalues/EigenSolver.h"
                        ,0xf5,
                        "const EigenvalueType &Eigen::EigenSolver<Eigen::Matrix<double, -1, -1>>::eigenvalues() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                       );
        }
        poVar9 = Eigen::operator<<((ostream *)&std::cout,
                                   (DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>
                                    *)&local_100);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        free(local_40);
        free(local_58);
        free(local_80);
        free(local_90);
        free(local_a8);
        free(local_b8);
        free(local_d0);
        free(local_e8);
        free(local_100);
        free((void *)local_118._0_8_);
      }
      return;
    }
    pcVar13 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
  }
  __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x3f,pcVar13);
}

Assistant:

void UnscentedKalmanFilter::PredictMeanAndCovariance(const MatrixXd &Xsig_pred, VectorXd &x, MatrixXd &P) const {

  x.fill(0.0);
  P.fill(0.0);

  // predicted state mean
  for (int i=0; i<n_sigma_; i++) {  // iterate over sigma points
      x += weights_m_(i) * Xsig_pred.col(i);
      //std::cout << i << std::fixed << ": " << x.transpose() << std::endl;
  }
  NormalizeState(x);

  // predicted state covariance matrix
  for (int i=(type_==UKFModified||type_==UKFEnhanced)?1:0; i<n_sigma_; i++) {  // iterate over sigma points

    // state difference
    VectorXd x_diff;
    if (type_==UKFModified||type_==UKFEnhanced)
        x_diff = Xsig_pred.col(i) - Xsig_pred.col(0);
    else
        x_diff = Xsig_pred.col(i) - x;

    NormalizeState(x_diff);

    P = P + weights_c_(i) * x_diff * x_diff.transpose();
  }

  if (debug_ > 2) {
    std::cout << "x pred:\n" << x << std::endl;
    std::cout << "P pred:\n" << P << std::endl;
    Eigen::EigenSolver<MatrixXd> es(P);
    std::cout << "Eigenvalues of P pred:\n" << es.eigenvalues() << std::endl;
  }
}